

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O1

void __thiscall
TEST_GlobalSimpleStringMemoryAccountant_report_Test::testBody
          (TEST_GlobalSimpleStringMemoryAccountant_report_Test *this)

{
  UtestShell *pUVar1;
  char *pcVar2;
  GlobalSimpleStringMemoryAccountant *this_00;
  SimpleString str;
  GlobalSimpleStringMemoryAccountant local_30;
  SimpleString local_20;
  
  SimpleString::SimpleString(&local_20,"");
  this_00 = &(this->super_TEST_GROUP_CppUTestGroupGlobalSimpleStringMemoryAccountant).accountant;
  GlobalSimpleStringMemoryAccountant::start(this_00);
  SimpleString::operator+=(&local_20,"More");
  GlobalSimpleStringMemoryAccountant::stop(this_00);
  pUVar1 = UtestShell::getCurrent();
  GlobalSimpleStringMemoryAccountant::report(&local_30);
  pcVar2 = SimpleString::asCharString((SimpleString *)&local_30);
  (*pUVar1->_vptr_UtestShell[0xc])
            (pUVar1," 1                0                 1",pcVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x8d);
  SimpleString::~SimpleString((SimpleString *)&local_30);
  SimpleString::~SimpleString(&local_20);
  return;
}

Assistant:

TEST(GlobalSimpleStringMemoryAccountant, report)
{
    SimpleString str;
    accountant.start();
    str += "More";
    accountant.stop();
    STRCMP_CONTAINS(" 1                0                 1", accountant.report().asCharString());
}